

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O0

CallInfo * luaE_extendCI(lua_State *L)

{
  CallInfo *pCVar1;
  CallInfo *ci;
  lua_State *L_local;
  
  pCVar1 = (CallInfo *)luaM_realloc_(L,(void *)0x0,0,0x48);
  L->ci->next = pCVar1;
  pCVar1->previous = L->ci;
  pCVar1->next = (CallInfo *)0x0;
  L->nci = L->nci + 1;
  return pCVar1;
}

Assistant:

CallInfo *luaE_extendCI (lua_State *L) {
  CallInfo *ci = luaM_new(L, CallInfo);
  lua_assert(L->ci->next == NULL);
  L->ci->next = ci;
  ci->previous = L->ci;
  ci->next = NULL;
  L->nci++;
  return ci;
}